

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::symbol_codec::start_decoding(symbol_codec *this,uint8 *pBuf,uint32 buf_size)

{
  uint in_EDX;
  uint8 *in_RSI;
  symbol_codec *in_RDI;
  
  if (in_EDX != 0) {
    in_RDI->m_pDecode_buf = in_RSI;
    in_RDI->m_pDecode_buf_next = in_RSI;
    in_RDI->m_decode_buf_size = in_EDX;
    in_RDI->m_pDecode_buf_end = in_RSI + in_EDX;
    get_bits_init(in_RDI);
  }
  return in_EDX != 0;
}

Assistant:

bool symbol_codec::start_decoding(const uint8* pBuf, uint32 buf_size) {
  if (!buf_size)
    return false;

  m_pDecode_buf = pBuf;
  m_pDecode_buf_next = pBuf;
  m_decode_buf_size = buf_size;
  m_pDecode_buf_end = pBuf + buf_size;

  get_bits_init();

  return true;
}